

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form2_Accumulate(AccumulateForm2 Accumulate)

{
  uint8_t value;
  bool bVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  AccumulateForm2 p_Var5;
  pointer puVar6;
  uint uVar7;
  pointer puVar8;
  long lVar9;
  ulong uVar10;
  pointer puVar11;
  uint *puVar12;
  ushort uVar13;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  allocator_type local_f1;
  uint32_t local_f0;
  uint32_t local_ec;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_e8;
  AccumulateForm2 local_c8;
  value_type_conflict4 local_bc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  undefined1 local_88 [48];
  undefined1 local_58 [40];
  undefined1 auVar14 [16];
  
  local_c8 = Accumulate;
  uVar7 = rand();
  Unit_Test::intensityArray(&local_a0,(uVar7 & 0xf) + (uint)((uVar7 & 0xf) == 0));
  puVar6 = local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_e8.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar11 = local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      value = *puVar11;
      PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
                ((ImageTemplate<unsigned_char> *)local_88,0,0,'\x01','\x01');
      Test_Helper::uniformImage
                ((Image *)local_58,value,0,0,(ImageTemplate<unsigned_char> *)local_88);
      std::
      vector<PenguinV_Image::ImageTemplate<unsigned_char>,std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>>>
      ::emplace_back<PenguinV_Image::ImageTemplate<unsigned_char>>
                ((vector<PenguinV_Image::ImageTemplate<unsigned_char>,std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>>>
                  *)&local_e8,(Image *)local_58);
      local_58._0_8_ = &PTR__ImageTemplate_00219948;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear((Image *)local_58);
      local_88._0_8_ = &PTR__ImageTemplate_00219948;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_88);
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar6);
  }
  local_58._0_16_ = (undefined1  [16])0x0;
  local_58._16_8_ = (pointer)0x0;
  local_88._16_8_ = (pointer)0x0;
  local_88._0_16_ = (undefined1  [16])0x0;
  Unit_Test::generateRoi
            (&local_e8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,&local_ec,&local_f0);
  local_bc = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_b8,(ulong)(local_f0 * local_ec),&local_bc,&local_f1);
  p_Var5 = local_c8;
  if (local_e8.
      super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_e8.
      super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      (*p_Var5)((Image *)((long)&(local_e8.
                                  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_ImageTemplate +
                         lVar9),*(uint32_t *)(local_58._0_8_ + uVar10 * 4),
                *(uint32_t *)(local_88._0_8_ + uVar10 * 4),local_ec,local_f0,&local_b8);
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x28;
    } while (uVar10 < (ulong)(((long)local_e8.
                                     super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_e8.
                                     super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x3333333333333333));
  }
  if (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar7 = 0;
  }
  else {
    auVar17 = vpbroadcastq_avx512f();
    auVar22 = ZEXT1664((undefined1  [16])0x0);
    uVar10 = 0;
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar20 = vmovdqa64_avx512f(auVar22);
      auVar22 = vpbroadcastq_avx512f();
      auVar21 = vporq_avx512f(auVar22,auVar18);
      auVar22 = vporq_avx512f(auVar22,auVar19);
      uVar2 = vpcmpuq_avx512f(auVar22,auVar17,2);
      bVar3 = (byte)uVar2;
      uVar2 = vpcmpuq_avx512f(auVar21,auVar17,2);
      bVar4 = (byte)uVar2;
      uVar13 = CONCAT11(bVar4,bVar3);
      auVar14 = vmovdqu8_avx512vl(*(undefined1 (*) [16])
                                   (local_a0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar10));
      auVar15[1] = ((byte)(uVar13 >> 1) & 1) * auVar14[1];
      auVar15[0] = (bVar3 & 1) * auVar14[0];
      auVar15[2] = ((byte)(uVar13 >> 2) & 1) * auVar14[2];
      auVar15[3] = ((byte)(uVar13 >> 3) & 1) * auVar14[3];
      auVar15[4] = ((byte)(uVar13 >> 4) & 1) * auVar14[4];
      auVar15[5] = ((byte)(uVar13 >> 5) & 1) * auVar14[5];
      auVar15[6] = ((byte)(uVar13 >> 6) & 1) * auVar14[6];
      auVar15[7] = ((byte)(uVar13 >> 7) & 1) * auVar14[7];
      auVar15[8] = (bVar4 & 1) * auVar14[8];
      auVar15[9] = (bVar4 >> 1 & 1) * auVar14[9];
      auVar15[10] = (bVar4 >> 2 & 1) * auVar14[10];
      auVar15[0xb] = (bVar4 >> 3 & 1) * auVar14[0xb];
      auVar15[0xc] = (bVar4 >> 4 & 1) * auVar14[0xc];
      auVar15[0xd] = (bVar4 >> 5 & 1) * auVar14[0xd];
      auVar15[0xe] = (bVar4 >> 6 & 1) * auVar14[0xe];
      auVar15[0xf] = -((char)bVar4 >> 7) * auVar14[0xf];
      auVar22 = vpmovzxbd_avx512f(auVar15);
      auVar22 = vpaddd_avx512f(auVar20,auVar22);
      uVar10 = uVar10 + 0x10;
    } while (((ulong)(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0xf - (long)local_a0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start)) & 0xfffffffffffffff0)
             != uVar10);
    auVar17 = vmovdqa32_avx512f(auVar22);
    auVar18._0_4_ = (uint)(bVar3 & 1) * auVar17._0_4_ | (uint)!(bool)(bVar3 & 1) * auVar20._0_4_;
    bVar1 = (bool)((byte)(uVar13 >> 1) & 1);
    auVar18._4_4_ = (uint)bVar1 * auVar17._4_4_ | (uint)!bVar1 * auVar20._4_4_;
    bVar1 = (bool)((byte)(uVar13 >> 2) & 1);
    auVar18._8_4_ = (uint)bVar1 * auVar17._8_4_ | (uint)!bVar1 * auVar20._8_4_;
    bVar1 = (bool)((byte)(uVar13 >> 3) & 1);
    auVar18._12_4_ = (uint)bVar1 * auVar17._12_4_ | (uint)!bVar1 * auVar20._12_4_;
    bVar1 = (bool)((byte)(uVar13 >> 4) & 1);
    auVar18._16_4_ = (uint)bVar1 * auVar17._16_4_ | (uint)!bVar1 * auVar20._16_4_;
    bVar1 = (bool)((byte)(uVar13 >> 5) & 1);
    auVar18._20_4_ = (uint)bVar1 * auVar17._20_4_ | (uint)!bVar1 * auVar20._20_4_;
    bVar1 = (bool)((byte)(uVar13 >> 6) & 1);
    auVar18._24_4_ = (uint)bVar1 * auVar17._24_4_ | (uint)!bVar1 * auVar20._24_4_;
    bVar1 = (bool)((byte)(uVar13 >> 7) & 1);
    auVar18._28_4_ = (uint)bVar1 * auVar17._28_4_ | (uint)!bVar1 * auVar20._28_4_;
    auVar18._32_4_ = (uint)(bVar4 & 1) * auVar17._32_4_ | (uint)!(bool)(bVar4 & 1) * auVar20._32_4_;
    bVar1 = (bool)(bVar4 >> 1 & 1);
    auVar18._36_4_ = (uint)bVar1 * auVar17._36_4_ | (uint)!bVar1 * auVar20._36_4_;
    bVar1 = (bool)(bVar4 >> 2 & 1);
    auVar18._40_4_ = (uint)bVar1 * auVar17._40_4_ | (uint)!bVar1 * auVar20._40_4_;
    bVar1 = (bool)(bVar4 >> 3 & 1);
    auVar18._44_4_ = (uint)bVar1 * auVar17._44_4_ | (uint)!bVar1 * auVar20._44_4_;
    bVar1 = (bool)(bVar4 >> 4 & 1);
    auVar18._48_4_ = (uint)bVar1 * auVar17._48_4_ | (uint)!bVar1 * auVar20._48_4_;
    bVar1 = (bool)(bVar4 >> 5 & 1);
    auVar18._52_4_ = (uint)bVar1 * auVar17._52_4_ | (uint)!bVar1 * auVar20._52_4_;
    bVar1 = (bool)(bVar4 >> 6 & 1);
    auVar18._56_4_ = (uint)bVar1 * auVar17._56_4_ | (uint)!bVar1 * auVar20._56_4_;
    auVar18._60_4_ =
         (uint)(bVar4 >> 7) * auVar17._60_4_ | (uint)!(bool)(bVar4 >> 7) * auVar20._60_4_;
    auVar16 = vextracti64x4_avx512f(auVar18,1);
    auVar17 = vpaddd_avx512f(auVar18,ZEXT3264(auVar16));
    auVar14 = vpaddd_avx(auVar17._0_16_,auVar17._16_16_);
    auVar15 = vpshufd_avx(auVar14,0xee);
    auVar14 = vpaddd_avx(auVar14,auVar15);
    auVar15 = vpshufd_avx(auVar14,0x55);
    auVar14 = vpaddd_avx(auVar14,auVar15);
    uVar7 = auVar14._0_4_;
  }
  lVar9 = (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start >> 4;
  puVar8 = local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < lVar9) {
    puVar8 = (pointer)(((long)local_b8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_b8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xfffffffffffffff0U) +
                      (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    lVar9 = lVar9 + 1;
    puVar12 = local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start + 2;
    do {
      if (uVar7 != puVar12[-2]) {
        puVar12 = puVar12 + -2;
        goto LAB_0014c3a4;
      }
      if (uVar7 != puVar12[-1]) {
        puVar12 = puVar12 + -1;
        goto LAB_0014c3a4;
      }
      if (uVar7 != *puVar12) goto LAB_0014c3a4;
      if (uVar7 != puVar12[1]) {
        puVar12 = puVar12 + 1;
        goto LAB_0014c3a4;
      }
      lVar9 = lVar9 + -1;
      puVar12 = puVar12 + 4;
    } while (1 < lVar9);
  }
  lVar9 = (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar8 >> 2;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      puVar12 = local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((lVar9 != 3) || (puVar12 = puVar8, uVar7 != *puVar8)) goto LAB_0014c3a4;
      puVar8 = puVar8 + 1;
    }
    puVar12 = puVar8;
    if (uVar7 != *puVar8) goto LAB_0014c3a4;
    puVar8 = puVar8 + 1;
  }
  puVar12 = puVar8;
  if (uVar7 == *puVar8) {
    puVar12 = local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
LAB_0014c3a4:
  if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if ((_func_int **)local_88._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_88._0_8_);
  }
  if ((_func_int **)local_58._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_58._0_8_);
  }
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&local_e8);
  if (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return puVar12 ==
         local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
}

Assistant:

bool form2_Accumulate(AccumulateForm2 Accumulate)
    {
        const std::vector < uint8_t > intensity = intensityArray( randomValue<uint8_t>( 1, 16 ) );
        std::vector < PenguinV_Image::Image > input;

        std::for_each( intensity.begin(), intensity.end(), [&]( uint8_t value )
        { input.push_back( uniformImage( value ) ); } );

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        std::vector < uint32_t > result( roiWidth * roiHeight, 0 );

        for( size_t imageId = 0; imageId < input.size(); ++imageId ) {
            Accumulate( input[imageId], roiX[imageId], roiY[imageId], roiWidth, roiHeight, result );
        }

        const uint32_t sum = std::accumulate( intensity.begin(), intensity.end(), 0u );

        return std::all_of( result.begin(), result.end(), [&sum]( uint32_t v ) { return v == sum; } );
    }